

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall
phosg::BitReader::BitReader
          (BitReader *this,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,size_t offset)

{
  element_type *peVar1;
  uint8_t *puVar2;
  size_type sVar3;
  size_t offset_local;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *data_local;
  BitReader *this_local;
  
  this->_vptr_BitReader = (_func_int **)&PTR__BitReader_00152c80;
  ::std::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shared_ptr(&this->owned_data,data);
  peVar1 = ::std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)data);
  puVar2 = (uint8_t *)
           ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (peVar1);
  this->data = puVar2;
  peVar1 = ::std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)data);
  sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (peVar1);
  this->length = sVar3 << 3;
  this->offset = offset;
  return;
}

Assistant:

BitReader::BitReader(shared_ptr<string> data, size_t offset)
    : owned_data(data),
      data(reinterpret_cast<const uint8_t*>(data->data())),
      length(data->size() * 8),
      offset(offset) {}